

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

Message * __thiscall
google::protobuf::internal::GeneratedMessageReflection::MutableMessage
          (GeneratedMessageReflection *this,Message *message,FieldDescriptor *field,
          MessageFactory *factory)

{
  OneofDescriptor *oneof_descriptor;
  long lVar1;
  Type TVar2;
  uint32 uVar3;
  int iVar4;
  MessageLite *pMVar5;
  Message *pMVar6;
  long *plVar7;
  long *plVar8;
  
  if (*(Descriptor **)(field + 0x58) != this->descriptor_) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"MutableMessage","Field does not match message type.");
  }
  if (*(int *)(field + 0x4c) == 3) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"MutableMessage",
               "Field is repeated; the method requires a singular field.");
  }
  TVar2 = FieldDescriptor::type(field);
  if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)TVar2 * 4) != 10) {
    anon_unknown_0::ReportReflectionUsageTypeError
              (this->descriptor_,field,"MutableMessage",CPPTYPE_MESSAGE);
  }
  if (field[0x50] == (FieldDescriptor)0x1) {
    if (factory == (MessageFactory *)0x0) {
      factory = this->message_factory_;
    }
    uVar3 = ReflectionSchema::GetExtensionSetOffset(&this->schema_);
    pMVar5 = ExtensionSet::MutableMessage
                       ((ExtensionSet *)
                        ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar3),field
                        ,factory);
    return (Message *)pMVar5;
  }
  uVar3 = ReflectionSchema::GetFieldOffset(&this->schema_,field);
  oneof_descriptor = *(OneofDescriptor **)(field + 0x60);
  if (oneof_descriptor == (OneofDescriptor *)0x0) {
    SetBit(this,message,field);
  }
  else if (*(int *)((long)&(message->super_MessageLite)._vptr_MessageLite +
                   (ulong)(uint)((int)((ulong)((long)oneof_descriptor -
                                              *(long *)(*(long *)(oneof_descriptor + 0x10) + 0x40))
                                      >> 4) * -0x55555554 + (this->schema_).oneof_case_offset_)) !=
           *(int *)(field + 0x38)) {
    ClearOneof(this,message,oneof_descriptor);
    lVar1 = *(long *)(field + 0x60);
    if (lVar1 == 0) {
      SetBit(this,message,field);
    }
    else {
      *(undefined4 *)
       ((long)&(message->super_MessageLite)._vptr_MessageLite +
       (ulong)(uint)((int)((ulong)(lVar1 - *(long *)(*(long *)(lVar1 + 0x10) + 0x40)) >> 4) *
                     -0x55555554 + (this->schema_).oneof_case_offset_)) =
           *(undefined4 *)(field + 0x38);
    }
    uVar3 = ReflectionSchema::GetFieldOffset(&this->schema_,field);
    plVar8 = (long *)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar3);
    if (field[0x50] == (FieldDescriptor)0x0) {
      plVar7 = (long *)(*(long *)(field + 0x58) + 0x30);
    }
    else if (*(long *)(field + 0x68) == 0) {
      plVar7 = (long *)(*(long *)(field + 0x30) + 0x98);
    }
    else {
      plVar7 = (long *)(*(long *)(field + 0x68) + 0x80);
    }
    plVar7 = *(long **)((long)&(((this->schema_).default_instance_)->super_MessageLite).
                               _vptr_MessageLite +
                       (ulong)(this->schema_).offsets_
                              [(int)((ulong)((long)field - *plVar7) >> 3) * 0x3cf3cf3d]);
    iVar4 = (*(message->super_MessageLite)._vptr_MessageLite[5])(message);
    pMVar6 = (Message *)(**(code **)(*plVar7 + 0x20))(plVar7,iVar4);
    *plVar8 = (long)pMVar6;
    goto LAB_005ae944;
  }
  plVar8 = (long *)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar3);
  pMVar6 = (Message *)*plVar8;
LAB_005ae944:
  if (pMVar6 == (Message *)0x0) {
    if (field[0x50] == (FieldDescriptor)0x0) {
      plVar7 = (long *)(*(long *)(field + 0x58) + 0x30);
    }
    else if (*(long *)(field + 0x68) == 0) {
      plVar7 = (long *)(*(long *)(field + 0x30) + 0x98);
    }
    else {
      plVar7 = (long *)(*(long *)(field + 0x68) + 0x80);
    }
    plVar7 = *(long **)((long)&(((this->schema_).default_instance_)->super_MessageLite).
                               _vptr_MessageLite +
                       (ulong)(this->schema_).offsets_
                              [(int)((ulong)((long)field - *plVar7) >> 3) * 0x3cf3cf3d]);
    iVar4 = (*(message->super_MessageLite)._vptr_MessageLite[5])(message);
    pMVar6 = (Message *)(**(code **)(*plVar7 + 0x20))(plVar7,iVar4);
    *plVar8 = (long)pMVar6;
  }
  return pMVar6;
}

Assistant:

Message* GeneratedMessageReflection::MutableMessage(
    Message* message, const FieldDescriptor* field,
    MessageFactory* factory) const {
  USAGE_CHECK_ALL(MutableMessage, SINGULAR, MESSAGE);

  if (factory == NULL) factory = message_factory_;

  if (field->is_extension()) {
    return static_cast<Message*>(
        MutableExtensionSet(message)->MutableMessage(field, factory));
  } else {
    Message* result;

    Message** result_holder = MutableRaw<Message*>(message, field);

    if (field->containing_oneof()) {
      if (!HasOneofField(*message, field)) {
        ClearOneof(message, field->containing_oneof());
        result_holder = MutableField<Message*>(message, field);
        const Message* default_message = DefaultRaw<const Message*>(field);
        *result_holder = default_message->New(message->GetArena());
      }
    } else {
      SetBit(message, field);
    }

    if (*result_holder == NULL) {
      const Message* default_message = DefaultRaw<const Message*>(field);
      *result_holder = default_message->New(message->GetArena());
    }
    result = *result_holder;
    return result;
  }
}